

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

sunrealtype N_VMinLocal_ManyVector(N_Vector x)

{
  long *plVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  plVar1 = (long *)x->content;
  if (*plVar1 < 1) {
    dVar3 = 1.79769313486232e+308;
  }
  else {
    dVar3 = 1.79769313486232e+308;
    lVar2 = 0;
    do {
      if (*(long *)(*(long *)(*(long *)(plVar1[2] + lVar2 * 8) + 8) + 0x150) == 0) {
        dVar4 = (double)N_VMin();
      }
      else {
        dVar4 = (double)N_VMinLocal();
      }
      if (dVar4 <= dVar3) {
        dVar3 = dVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
    } while (lVar2 < *plVar1);
  }
  return dVar3;
}

Assistant:

sunrealtype MVAPPEND(N_VMinLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype min, lmin;

  /* initialize output*/
  min = SUN_BIG_REAL;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvminlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvminlocal)
    {
      lmin = N_VMinLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;

      /* otherwise, call nvmin and accumulate to overall min */
    }
    else
    {
      lmin = N_VMin(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;
    }
  }

  return (min);
}